

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCamera>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,GeomCamera *camera
               ,string *warn,string *err,PrimReconstructOptions *options)

{
  long *plVar1;
  uint uVar2;
  char *pcVar3;
  undefined1 auVar4 [8];
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  undefined1 uVar8;
  int iVar9;
  ostream *poVar10;
  long *plVar11;
  const_iterator cVar12;
  mapped_type *this;
  _Base_ptr p_Var13;
  Property *pPVar14;
  pointer __n;
  ulong uVar15;
  undefined8 uVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  char *pcVar17;
  Property *args_1;
  char cVar18;
  _Rb_tree_header *p_Var19;
  TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *pTVar20;
  bool bVar21;
  byte bVar22;
  undefined1 auVar23 [8];
  long lVar24;
  Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_> dst;
  ParseResult ret;
  Attribute *attr;
  string attr_type_name;
  ostringstream ss_e;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  undefined8 in_stack_fffffffffffffa48;
  TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *pTVar25;
  undefined1 local_5b0 [8];
  char *local_5a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a0;
  string local_588;
  TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
  local_568;
  TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *local_548;
  undefined1 local_540 [8];
  undefined1 local_538 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528;
  pointer local_518;
  _Alloc_hider _Stack_510;
  size_type local_508;
  bool abStack_500 [16];
  storage_union local_4f0;
  TypedAttributeWithFallback<tinyusdz::GeomCamera::StereoRole> *local_4e0;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>_> *local_4d8;
  AttrMetas *local_4d0;
  byte local_4c8;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> local_4c0;
  undefined1 local_4a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  undefined1 local_478 [32];
  undefined1 local_458 [8];
  undefined1 auStack_450 [8];
  undefined1 local_448 [8];
  undefined1 auStack_440 [88];
  ios_base local_3e8 [16];
  ios_base local_3d8 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d0;
  undefined1 local_2a0 [48];
  undefined1 local_270 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  undefined1 local_240 [32];
  _Alloc_hider local_220;
  undefined1 local_218 [32];
  optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_> local_1f8
  ;
  undefined1 local_1d8 [24];
  optional<tinyusdz::Path::PathType> oStack_1c0;
  _Any_data local_1b8;
  pointer local_1a8;
  _Alloc_hider _Stack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  undefined1 local_170 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  _Alloc_hider local_140 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  undefined1 local_f0 [32];
  undefined1 local_d0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined1 local_a0 [16];
  undefined1 local_90 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  char local_40 [16];
  
  local_2d0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2d0._M_impl.super__Rb_tree_header._M_header;
  local_2d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bVar21 = false;
  local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2d0._M_impl.super__Rb_tree_header._M_node_count = 0;
  pTVar25 = (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
            CONCAT44((int)((ulong)in_stack_fffffffffffffa48 >> 0x20),
                     (uint)options->strict_allowedToken_check);
  local_548 = (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)err;
  local_2d0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2d0._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar7 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_2d0,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,&camera->super_GPrim,warn,err,options->strict_allowedToken_check)
  ;
  if (bVar7) {
    p_Var13 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var19 = &(properties->_M_t)._M_impl.super__Rb_tree_header;
    bVar21 = true;
    if ((_Rb_tree_header *)p_Var13 != p_Var19) {
      local_218._24_8_ = &camera->focalLength;
      local_218._8_8_ = &camera->focusDistance;
      local_218._0_8_ = &camera->exposure;
      local_220._M_p = (pointer)&camera->fStop;
      local_240._24_8_ = &camera->horizontalAperture;
      local_240._16_8_ = &camera->horizontalApertureOffset;
      local_240._8_8_ = &camera->verticalAperture;
      local_240._0_8_ = &camera->verticalApertureOffset;
      local_250._8_8_ = &camera->clippingRange;
      local_4d0 = &(camera->clippingPlanes)._metas;
      local_270._24_8_ = &(camera->clippingPlanes)._paths;
      local_270._8_8_ = &(camera->clippingPlanes)._attrib;
      local_250._M_allocated_capacity = (size_type)&camera->shutterOpen;
      local_270._16_8_ = &camera->shutterClose;
      local_270._0_8_ = &(camera->super_GPrim).props;
      local_4e0 = &camera->stereoRole;
      local_4d8 = &camera->projection;
      local_4f0._8_8_ = warn;
      local_478._24_8_ = camera;
      local_218._16_8_ = p_Var19;
      do {
        local_50._M_allocated_capacity = (size_type)local_40;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,*(long *)(p_Var13 + 1),
                   (long)&(p_Var13[1]._M_parent)->_M_color + *(long *)(p_Var13 + 1));
        local_4f0.dynamic = p_Var13;
        local_458 = (undefined1  [8])local_448;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"focalLength","");
        pPVar14 = (Property *)local_458;
        abStack_500._8_8_ = (Property *)(p_Var13 + 2);
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_540,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_2d0,(string *)&local_50,(Property *)(p_Var13 + 2),(string *)local_458,
                   (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)local_218._24_8_);
        if (local_458 != (undefined1  [8])local_448) {
          operator_delete((void *)local_458,(ulong)((long)local_448 + 1));
        }
        if ((char *)local_50._M_allocated_capacity != local_40) {
          operator_delete((void *)local_50._M_allocated_capacity,local_40._0_8_ + 1);
        }
        uVar16 = local_4f0.dynamic;
        iVar9 = 0;
        if (((ulong)local_540 & 0xfffffffd) == 0) {
          iVar9 = 3;
LAB_00212aca:
          bVar7 = false;
        }
        else {
          bVar7 = true;
          if (local_540._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_458,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_458,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"():",3);
            poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_458,0xeee);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            local_5b0 = (undefined1  [8])&local_5a0;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5b0,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[12],std::__cxx11::string>
                      (&local_588,(fmt *)local_5b0,(string *)"focalLength",(char (*) [12])local_538,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar14)
            ;
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_458,local_588._M_dataplus._M_p,
                                 CONCAT62(local_588._M_string_length._2_6_,
                                          (undefined2)local_588._M_string_length));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_588._M_dataplus._M_p != &local_588.field_2) {
              operator_delete(local_588._M_dataplus._M_p,
                              CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                       local_588.field_2._M_allocated_capacity._0_2_) + 1);
            }
            pTVar20 = local_548;
            if (local_5b0 != (undefined1  [8])&local_5a0) {
              operator_delete((void *)local_5b0,(ulong)(local_5a0._M_allocated_capacity + 1));
            }
            if (pTVar20 !=
                (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar11 = (long *)::std::__cxx11::string::_M_append
                                          (local_5b0,(ulong)(pTVar20->_metas).interpolation);
              plVar1 = plVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar1) {
                local_588.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                local_588.field_2._M_allocated_capacity._2_6_ = (undefined6)((ulong)*plVar1 >> 0x10)
                ;
                local_588.field_2._8_2_ = (undefined2)plVar11[3];
                local_588.field_2._10_6_ = (undefined6)((ulong)plVar11[3] >> 0x10);
                local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
              }
              else {
                local_588.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                local_588.field_2._M_allocated_capacity._2_6_ = (undefined6)((ulong)*plVar1 >> 0x10)
                ;
                local_588._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_588._M_string_length._0_2_ = (undefined2)plVar11[1];
              local_588._M_string_length._2_6_ = (undefined6)((ulong)plVar11[1] >> 0x10);
              *plVar11 = (long)plVar1;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)pTVar20,(string *)&local_588);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_588._M_dataplus._M_p != &local_588.field_2) {
                operator_delete(local_588._M_dataplus._M_p,
                                CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                         local_588.field_2._M_allocated_capacity._0_2_) + 1);
              }
              if (local_5b0 != (undefined1  [8])&local_5a0) {
                operator_delete((void *)local_5b0,(ulong)(local_5a0._M_allocated_capacity + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
            ::std::ios_base::~ios_base(local_3e8);
            iVar9 = 1;
            goto LAB_00212aca;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._0_8_ != &local_528) {
          operator_delete((void *)local_538._0_8_,(ulong)(local_528._M_allocated_capacity + 1));
        }
        if (bVar7) {
          local_70._M_allocated_capacity = (size_type)&local_60;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,*(long *)(uVar16 + 0x20),
                     (long)&(*(_Base_ptr *)(uVar16 + 0x28))->_M_color + *(long *)(uVar16 + 0x20));
          local_458 = (undefined1  [8])local_448;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"focusDistance","");
          pPVar14 = (Property *)local_458;
          anon_unknown_0::ParseTypedAttribute<float>
                    ((ParseResult *)local_540,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2d0,(string *)&local_70,(Property *)abStack_500._8_8_,
                     (string *)local_458,
                     (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)local_218._8_8_);
          if (local_458 != (undefined1  [8])local_448) {
            operator_delete((void *)local_458,(ulong)((long)local_448 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_allocated_capacity != &local_60) {
            operator_delete((void *)local_70._M_allocated_capacity,
                            local_60._M_allocated_capacity + 1);
          }
          iVar9 = 0;
          if (((ulong)local_540 & 0xfffffffd) == 0) {
            iVar9 = 3;
LAB_00212ddf:
            bVar7 = false;
          }
          else {
            bVar7 = true;
            if (local_540._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_458,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_458,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_458,0xef0);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              local_5b0 = (undefined1  [8])&local_5a0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_5b0,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[14],std::__cxx11::string>
                        (&local_588,(fmt *)local_5b0,(string *)"focusDistance",
                         (char (*) [14])local_538,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar14);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_458,local_588._M_dataplus._M_p,
                                   CONCAT62(local_588._M_string_length._2_6_,
                                            (undefined2)local_588._M_string_length));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_588._M_dataplus._M_p != &local_588.field_2) {
                operator_delete(local_588._M_dataplus._M_p,
                                CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                         local_588.field_2._M_allocated_capacity._0_2_) + 1);
              }
              pTVar20 = local_548;
              if (local_5b0 != (undefined1  [8])&local_5a0) {
                operator_delete((void *)local_5b0,(ulong)(local_5a0._M_allocated_capacity + 1));
              }
              if (pTVar20 !=
                  (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)0x0)
              {
                ::std::__cxx11::stringbuf::str();
                plVar11 = (long *)::std::__cxx11::string::_M_append
                                            (local_5b0,(ulong)(pTVar20->_metas).interpolation);
                plVar1 = plVar11 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar1) {
                  local_588.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                  local_588.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*plVar1 >> 0x10);
                  local_588.field_2._8_2_ = (undefined2)plVar11[3];
                  local_588.field_2._10_6_ = (undefined6)((ulong)plVar11[3] >> 0x10);
                  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
                }
                else {
                  local_588.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                  local_588.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*plVar1 >> 0x10);
                  local_588._M_dataplus._M_p = (pointer)*plVar11;
                }
                local_588._M_string_length._0_2_ = (undefined2)plVar11[1];
                local_588._M_string_length._2_6_ = (undefined6)((ulong)plVar11[1] >> 0x10);
                *plVar11 = (long)plVar1;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)pTVar20,(string *)&local_588);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_588._M_dataplus._M_p != &local_588.field_2) {
                  operator_delete(local_588._M_dataplus._M_p,
                                  CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                           local_588.field_2._M_allocated_capacity._0_2_) + 1);
                }
                if (local_5b0 != (undefined1  [8])&local_5a0) {
                  operator_delete((void *)local_5b0,(ulong)(local_5a0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
              ::std::ios_base::~ios_base(local_3e8);
              iVar9 = 1;
              goto LAB_00212ddf;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._0_8_ != &local_528) {
            operator_delete((void *)local_538._0_8_,(ulong)(local_528._M_allocated_capacity + 1));
          }
          if (!bVar7) goto LAB_00215ecd;
          local_90._0_8_ = (long)local_90 + 0x10;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_90,*(long *)(uVar16 + 0x20),
                     (long)&(*(_Base_ptr *)(uVar16 + 0x28))->_M_color + *(long *)(uVar16 + 0x20));
          local_458 = (undefined1  [8])local_448;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"exposure","");
          pPVar14 = (Property *)local_458;
          anon_unknown_0::ParseTypedAttribute<float>
                    ((ParseResult *)local_540,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2d0,(string *)local_90,(Property *)abStack_500._8_8_,
                     (string *)local_458,
                     (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)local_218._0_8_);
          if (local_458 != (undefined1  [8])local_448) {
            operator_delete((void *)local_458,(ulong)((long)local_448 + 1));
          }
          if (local_90._0_8_ != (long)local_90 + 0x10) {
            operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
          }
          iVar9 = 0;
          if (((ulong)local_540 & 0xfffffffd) == 0) {
            iVar9 = 3;
LAB_002130f4:
            bVar7 = false;
          }
          else {
            bVar7 = true;
            if (local_540._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_458,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_458,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_458,0xef1);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              local_5b0 = (undefined1  [8])&local_5a0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_5b0,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[9],std::__cxx11::string>
                        (&local_588,(fmt *)local_5b0,(string *)0x3abd09,(char (*) [9])local_538,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar14);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_458,local_588._M_dataplus._M_p,
                                   CONCAT62(local_588._M_string_length._2_6_,
                                            (undefined2)local_588._M_string_length));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_588._M_dataplus._M_p != &local_588.field_2) {
                operator_delete(local_588._M_dataplus._M_p,
                                CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                         local_588.field_2._M_allocated_capacity._0_2_) + 1);
              }
              pTVar20 = local_548;
              if (local_5b0 != (undefined1  [8])&local_5a0) {
                operator_delete((void *)local_5b0,(ulong)(local_5a0._M_allocated_capacity + 1));
              }
              if (pTVar20 !=
                  (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)0x0)
              {
                ::std::__cxx11::stringbuf::str();
                plVar11 = (long *)::std::__cxx11::string::_M_append
                                            (local_5b0,(ulong)(pTVar20->_metas).interpolation);
                plVar1 = plVar11 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar1) {
                  local_588.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                  local_588.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*plVar1 >> 0x10);
                  local_588.field_2._8_2_ = (undefined2)plVar11[3];
                  local_588.field_2._10_6_ = (undefined6)((ulong)plVar11[3] >> 0x10);
                  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
                }
                else {
                  local_588.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                  local_588.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*plVar1 >> 0x10);
                  local_588._M_dataplus._M_p = (pointer)*plVar11;
                }
                local_588._M_string_length._0_2_ = (undefined2)plVar11[1];
                local_588._M_string_length._2_6_ = (undefined6)((ulong)plVar11[1] >> 0x10);
                *plVar11 = (long)plVar1;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)pTVar20,(string *)&local_588);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_588._M_dataplus._M_p != &local_588.field_2) {
                  operator_delete(local_588._M_dataplus._M_p,
                                  CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                           local_588.field_2._M_allocated_capacity._0_2_) + 1);
                }
                if (local_5b0 != (undefined1  [8])&local_5a0) {
                  operator_delete((void *)local_5b0,(ulong)(local_5a0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
              ::std::ios_base::~ios_base(local_3e8);
              iVar9 = 1;
              goto LAB_002130f4;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._0_8_ != &local_528) {
            operator_delete((void *)local_538._0_8_,(ulong)(local_528._M_allocated_capacity + 1));
          }
          if (!bVar7) goto LAB_00215ecd;
          local_b0._M_allocated_capacity = (size_type)local_a0;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,*(long *)(uVar16 + 0x20),
                     (long)&(*(_Base_ptr *)(uVar16 + 0x28))->_M_color + *(long *)(uVar16 + 0x20));
          local_458 = (undefined1  [8])local_448;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"fStop","");
          pPVar14 = (Property *)local_458;
          anon_unknown_0::ParseTypedAttribute<float>
                    ((ParseResult *)local_540,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2d0,(string *)&local_b0,(Property *)abStack_500._8_8_,
                     (string *)local_458,
                     (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)local_220._M_p);
          if (local_458 != (undefined1  [8])local_448) {
            operator_delete((void *)local_458,(ulong)((long)local_448 + 1));
          }
          if ((undefined1 *)local_b0._M_allocated_capacity != local_a0) {
            operator_delete((void *)local_b0._M_allocated_capacity,local_a0._0_8_ + 1);
          }
          iVar9 = 0;
          if (((ulong)local_540 & 0xfffffffd) == 0) {
            iVar9 = 3;
LAB_00213409:
            bVar7 = false;
          }
          else {
            bVar7 = true;
            if (local_540._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_458,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_458,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_458,0xef2);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              local_5b0 = (undefined1  [8])&local_5a0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_5b0,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[6],std::__cxx11::string>
                        (&local_588,(fmt *)local_5b0,(string *)"fStop",(char (*) [6])local_538,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar14);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_458,local_588._M_dataplus._M_p,
                                   CONCAT62(local_588._M_string_length._2_6_,
                                            (undefined2)local_588._M_string_length));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_588._M_dataplus._M_p != &local_588.field_2) {
                operator_delete(local_588._M_dataplus._M_p,
                                CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                         local_588.field_2._M_allocated_capacity._0_2_) + 1);
              }
              pTVar20 = local_548;
              if (local_5b0 != (undefined1  [8])&local_5a0) {
                operator_delete((void *)local_5b0,(ulong)(local_5a0._M_allocated_capacity + 1));
              }
              if (pTVar20 !=
                  (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)0x0)
              {
                ::std::__cxx11::stringbuf::str();
                plVar11 = (long *)::std::__cxx11::string::_M_append
                                            (local_5b0,(ulong)(pTVar20->_metas).interpolation);
                plVar1 = plVar11 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar1) {
                  local_588.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                  local_588.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*plVar1 >> 0x10);
                  local_588.field_2._8_2_ = (undefined2)plVar11[3];
                  local_588.field_2._10_6_ = (undefined6)((ulong)plVar11[3] >> 0x10);
                  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
                }
                else {
                  local_588.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                  local_588.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*plVar1 >> 0x10);
                  local_588._M_dataplus._M_p = (pointer)*plVar11;
                }
                local_588._M_string_length._0_2_ = (undefined2)plVar11[1];
                local_588._M_string_length._2_6_ = (undefined6)((ulong)plVar11[1] >> 0x10);
                *plVar11 = (long)plVar1;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)pTVar20,(string *)&local_588);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_588._M_dataplus._M_p != &local_588.field_2) {
                  operator_delete(local_588._M_dataplus._M_p,
                                  CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                           local_588.field_2._M_allocated_capacity._0_2_) + 1);
                }
                if (local_5b0 != (undefined1  [8])&local_5a0) {
                  operator_delete((void *)local_5b0,(ulong)(local_5a0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
              ::std::ios_base::~ios_base(local_3e8);
              iVar9 = 1;
              goto LAB_00213409;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._0_8_ != &local_528) {
            operator_delete((void *)local_538._0_8_,(ulong)(local_528._M_allocated_capacity + 1));
          }
          if (!bVar7) goto LAB_00215ecd;
          local_d0._0_8_ = local_d0 + 0x10;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d0,*(long *)(uVar16 + 0x20),
                     (long)&(*(_Base_ptr *)(uVar16 + 0x28))->_M_color + *(long *)(uVar16 + 0x20));
          local_458 = (undefined1  [8])local_448;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_458,"horizontalAperture","");
          pPVar14 = (Property *)local_458;
          anon_unknown_0::ParseTypedAttribute<float>
                    ((ParseResult *)local_540,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2d0,(string *)local_d0,(Property *)abStack_500._8_8_,
                     (string *)local_458,
                     (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)local_240._24_8_);
          if (local_458 != (undefined1  [8])local_448) {
            operator_delete((void *)local_458,(ulong)((long)local_448 + 1));
          }
          if ((pointer)local_d0._0_8_ != (pointer)(local_d0 + 0x10)) {
            operator_delete((void *)local_d0._0_8_,(ulong)(local_d0._16_8_ + 1));
          }
          iVar9 = 0;
          if (((ulong)local_540 & 0xfffffffd) == 0) {
            iVar9 = 3;
LAB_0021371e:
            bVar7 = false;
          }
          else {
            bVar7 = true;
            if (local_540._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_458,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_458,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_458,0xef4);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              local_5b0 = (undefined1  [8])&local_5a0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_5b0,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[19],std::__cxx11::string>
                        (&local_588,(fmt *)local_5b0,(string *)"horizontalAperture",
                         (char (*) [19])local_538,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar14);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_458,local_588._M_dataplus._M_p,
                                   CONCAT62(local_588._M_string_length._2_6_,
                                            (undefined2)local_588._M_string_length));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_588._M_dataplus._M_p != &local_588.field_2) {
                operator_delete(local_588._M_dataplus._M_p,
                                CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                         local_588.field_2._M_allocated_capacity._0_2_) + 1);
              }
              pTVar20 = local_548;
              if (local_5b0 != (undefined1  [8])&local_5a0) {
                operator_delete((void *)local_5b0,(ulong)(local_5a0._M_allocated_capacity + 1));
              }
              if (pTVar20 !=
                  (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)0x0)
              {
                ::std::__cxx11::stringbuf::str();
                plVar11 = (long *)::std::__cxx11::string::_M_append
                                            (local_5b0,(ulong)(pTVar20->_metas).interpolation);
                plVar1 = plVar11 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar1) {
                  local_588.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                  local_588.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*plVar1 >> 0x10);
                  local_588.field_2._8_2_ = (undefined2)plVar11[3];
                  local_588.field_2._10_6_ = (undefined6)((ulong)plVar11[3] >> 0x10);
                  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
                }
                else {
                  local_588.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                  local_588.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*plVar1 >> 0x10);
                  local_588._M_dataplus._M_p = (pointer)*plVar11;
                }
                local_588._M_string_length._0_2_ = (undefined2)plVar11[1];
                local_588._M_string_length._2_6_ = (undefined6)((ulong)plVar11[1] >> 0x10);
                *plVar11 = (long)plVar1;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)pTVar20,(string *)&local_588);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_588._M_dataplus._M_p != &local_588.field_2) {
                  operator_delete(local_588._M_dataplus._M_p,
                                  CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                           local_588.field_2._M_allocated_capacity._0_2_) + 1);
                }
                if (local_5b0 != (undefined1  [8])&local_5a0) {
                  operator_delete((void *)local_5b0,(ulong)(local_5a0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
              ::std::ios_base::~ios_base(local_3e8);
              iVar9 = 1;
              goto LAB_0021371e;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._0_8_ != &local_528) {
            operator_delete((void *)local_538._0_8_,(ulong)(local_528._M_allocated_capacity + 1));
          }
          if (!bVar7) goto LAB_00215ecd;
          local_f0._0_8_ = (long)local_f0 + 0x10;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_f0,*(long *)(uVar16 + 0x20),
                     (long)&(*(_Base_ptr *)(uVar16 + 0x28))->_M_color + *(long *)(uVar16 + 0x20));
          local_458 = (undefined1  [8])local_448;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_458,"horizontalApertureOffset","");
          pPVar14 = (Property *)local_458;
          anon_unknown_0::ParseTypedAttribute<float>
                    ((ParseResult *)local_540,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2d0,(string *)local_f0,(Property *)abStack_500._8_8_,
                     (string *)local_458,
                     (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)local_240._16_8_);
          if (local_458 != (undefined1  [8])local_448) {
            operator_delete((void *)local_458,(ulong)((long)local_448 + 1));
          }
          if (local_f0._0_8_ != (long)local_f0 + 0x10) {
            operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
          }
          iVar9 = 0;
          if (((ulong)local_540 & 0xfffffffd) == 0) {
            iVar9 = 3;
LAB_00213a33:
            bVar7 = false;
          }
          else {
            bVar7 = true;
            if (local_540._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_458,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_458,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_458,0xef6);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              local_5b0 = (undefined1  [8])&local_5a0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_5b0,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[25],std::__cxx11::string>
                        (&local_588,(fmt *)local_5b0,(string *)"horizontalApertureOffset",
                         (char (*) [25])local_538,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar14);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_458,local_588._M_dataplus._M_p,
                                   CONCAT62(local_588._M_string_length._2_6_,
                                            (undefined2)local_588._M_string_length));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_588._M_dataplus._M_p != &local_588.field_2) {
                operator_delete(local_588._M_dataplus._M_p,
                                CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                         local_588.field_2._M_allocated_capacity._0_2_) + 1);
              }
              pTVar20 = local_548;
              if (local_5b0 != (undefined1  [8])&local_5a0) {
                operator_delete((void *)local_5b0,(ulong)(local_5a0._M_allocated_capacity + 1));
              }
              if (pTVar20 !=
                  (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)0x0)
              {
                ::std::__cxx11::stringbuf::str();
                plVar11 = (long *)::std::__cxx11::string::_M_append
                                            (local_5b0,(ulong)(pTVar20->_metas).interpolation);
                plVar1 = plVar11 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar1) {
                  local_588.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                  local_588.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*plVar1 >> 0x10);
                  local_588.field_2._8_2_ = (undefined2)plVar11[3];
                  local_588.field_2._10_6_ = (undefined6)((ulong)plVar11[3] >> 0x10);
                  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
                }
                else {
                  local_588.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                  local_588.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*plVar1 >> 0x10);
                  local_588._M_dataplus._M_p = (pointer)*plVar11;
                }
                local_588._M_string_length._0_2_ = (undefined2)plVar11[1];
                local_588._M_string_length._2_6_ = (undefined6)((ulong)plVar11[1] >> 0x10);
                *plVar11 = (long)plVar1;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)pTVar20,(string *)&local_588);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_588._M_dataplus._M_p != &local_588.field_2) {
                  operator_delete(local_588._M_dataplus._M_p,
                                  CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                           local_588.field_2._M_allocated_capacity._0_2_) + 1);
                }
                if (local_5b0 != (undefined1  [8])&local_5a0) {
                  operator_delete((void *)local_5b0,(ulong)(local_5a0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
              ::std::ios_base::~ios_base(local_3e8);
              iVar9 = 1;
              goto LAB_00213a33;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._0_8_ != &local_528) {
            operator_delete((void *)local_538._0_8_,(ulong)(local_528._M_allocated_capacity + 1));
          }
          if (!bVar7) goto LAB_00215ecd;
          local_110._M_allocated_capacity = (size_type)&local_100;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_110,*(long *)(uVar16 + 0x20),
                     (long)&(*(_Base_ptr *)(uVar16 + 0x28))->_M_color + *(long *)(uVar16 + 0x20));
          local_458 = (undefined1  [8])local_448;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_458,"verticalAperture","");
          pPVar14 = (Property *)local_458;
          anon_unknown_0::ParseTypedAttribute<float>
                    ((ParseResult *)local_540,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2d0,(string *)&local_110,(Property *)abStack_500._8_8_,
                     (string *)local_458,
                     (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)local_240._8_8_);
          if (local_458 != (undefined1  [8])local_448) {
            operator_delete((void *)local_458,(ulong)((long)local_448 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_allocated_capacity != &local_100) {
            operator_delete((void *)local_110._M_allocated_capacity,
                            (ulong)(local_100._M_allocated_capacity + 1));
          }
          iVar9 = 0;
          if (((ulong)local_540 & 0xfffffffd) == 0) {
            iVar9 = 3;
LAB_00213d48:
            bVar7 = false;
          }
          else {
            bVar7 = true;
            if (local_540._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_458,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_458,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_458,0xef8);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              local_5b0 = (undefined1  [8])&local_5a0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_5b0,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[17],std::__cxx11::string>
                        (&local_588,(fmt *)local_5b0,(string *)"verticalAperture",
                         (char (*) [17])local_538,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar14);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_458,local_588._M_dataplus._M_p,
                                   CONCAT62(local_588._M_string_length._2_6_,
                                            (undefined2)local_588._M_string_length));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_588._M_dataplus._M_p != &local_588.field_2) {
                operator_delete(local_588._M_dataplus._M_p,
                                CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                         local_588.field_2._M_allocated_capacity._0_2_) + 1);
              }
              pTVar20 = local_548;
              if (local_5b0 != (undefined1  [8])&local_5a0) {
                operator_delete((void *)local_5b0,(ulong)(local_5a0._M_allocated_capacity + 1));
              }
              if (pTVar20 !=
                  (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)0x0)
              {
                ::std::__cxx11::stringbuf::str();
                plVar11 = (long *)::std::__cxx11::string::_M_append
                                            (local_5b0,(ulong)(pTVar20->_metas).interpolation);
                plVar1 = plVar11 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar1) {
                  local_588.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                  local_588.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*plVar1 >> 0x10);
                  local_588.field_2._8_2_ = (undefined2)plVar11[3];
                  local_588.field_2._10_6_ = (undefined6)((ulong)plVar11[3] >> 0x10);
                  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
                }
                else {
                  local_588.field_2._M_allocated_capacity._0_2_ = (undefined2)*plVar1;
                  local_588.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*plVar1 >> 0x10);
                  local_588._M_dataplus._M_p = (pointer)*plVar11;
                }
                local_588._M_string_length._0_2_ = (undefined2)plVar11[1];
                local_588._M_string_length._2_6_ = (undefined6)((ulong)plVar11[1] >> 0x10);
                *plVar11 = (long)plVar1;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)pTVar20,(string *)&local_588);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_588._M_dataplus._M_p != &local_588.field_2) {
                  operator_delete(local_588._M_dataplus._M_p,
                                  CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                           local_588.field_2._M_allocated_capacity._0_2_) + 1);
                }
                if (local_5b0 != (undefined1  [8])&local_5a0) {
                  operator_delete((void *)local_5b0,(ulong)(local_5a0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
              ::std::ios_base::~ios_base(local_3e8);
              iVar9 = 1;
              goto LAB_00213d48;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._0_8_ != &local_528) {
            operator_delete((void *)local_538._0_8_,(ulong)(local_528._M_allocated_capacity + 1));
          }
          if (!bVar7) goto LAB_00215ecd;
          local_130._M_allocated_capacity = (size_type)&local_120;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_130,*(long *)(uVar16 + 0x20),
                     (long)&(*(_Base_ptr *)(uVar16 + 0x28))->_M_color + *(long *)(uVar16 + 0x20));
          local_458 = (undefined1  [8])local_448;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_458,"verticalApertureOffset","");
          pPVar14 = (Property *)local_458;
          anon_unknown_0::ParseTypedAttribute<float>
                    ((ParseResult *)local_540,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2d0,(string *)&local_130,(Property *)abStack_500._8_8_,
                     (string *)local_458,
                     (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)local_240._0_8_);
          if (local_458 != (undefined1  [8])local_448) {
            operator_delete((void *)local_458,(ulong)((long)local_448 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_allocated_capacity != &local_120) {
            operator_delete((void *)local_130._M_allocated_capacity,
                            (ulong)(local_120._M_allocated_capacity + 1));
          }
          iVar9 = 0;
          if (((ulong)local_540 & 0xfffffffd) == 0) {
            iVar9 = 3;
LAB_00214017:
            bVar7 = false;
          }
          else {
            bVar7 = true;
            if (local_540._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_458,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_458,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_458,0xefa);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              local_5b0 = (undefined1  [8])&local_5a0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_5b0,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[23],std::__cxx11::string>
                        (&local_588,(fmt *)local_5b0,(string *)"verticalApertureOffset",
                         (char (*) [23])local_538,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar14);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_458,local_588._M_dataplus._M_p,
                                   CONCAT62(local_588._M_string_length._2_6_,
                                            (undefined2)local_588._M_string_length));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_588._M_dataplus._M_p != &local_588.field_2) {
                operator_delete(local_588._M_dataplus._M_p,
                                CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                         local_588.field_2._M_allocated_capacity._0_2_) + 1);
              }
              pTVar20 = local_548;
              if (local_5b0 != (undefined1  [8])&local_5a0) {
                operator_delete((void *)local_5b0,(ulong)(local_5a0._M_allocated_capacity + 1));
              }
              if (pTVar20 !=
                  (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)0x0)
              {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+(&local_588,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_5b0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pTVar20);
                ::std::__cxx11::string::operator=((string *)pTVar20,(string *)&local_588);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_588._M_dataplus._M_p != &local_588.field_2) {
                  operator_delete(local_588._M_dataplus._M_p,
                                  CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                           local_588.field_2._M_allocated_capacity._0_2_) + 1);
                }
                if (local_5b0 != (undefined1  [8])&local_5a0) {
                  operator_delete((void *)local_5b0,(ulong)(local_5a0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
              ::std::ios_base::~ios_base(local_3e8);
              iVar9 = 1;
              goto LAB_00214017;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._0_8_ != &local_528) {
            operator_delete((void *)local_538._0_8_,(ulong)(local_528._M_allocated_capacity + 1));
          }
          if (!bVar7) goto LAB_00215ecd;
          local_150._M_allocated_capacity = (size_type)local_140;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_150,*(long *)(uVar16 + 0x20),
                     (long)&(*(_Base_ptr *)(uVar16 + 0x28))->_M_color + *(long *)(uVar16 + 0x20));
          local_458 = (undefined1  [8])local_448;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"clippingRange","");
          pPVar14 = (Property *)abStack_500._8_8_;
          args_1 = (Property *)local_458;
          (anonymous_namespace)::ParseTypedAttribute<std::array<float,2ul>>
                    ((ParseResult *)local_540,(_anonymous_namespace_ *)&local_2d0,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_150,(string *)abStack_500._8_8_,(Property *)local_458,
                     (string *)local_250._8_8_,pTVar25);
          if (local_458 != (undefined1  [8])local_448) {
            operator_delete((void *)local_458,(ulong)((long)local_448 + 1));
          }
          if ((_Alloc_hider *)local_150._M_allocated_capacity != local_140) {
            operator_delete((void *)local_150._M_allocated_capacity,(ulong)(local_140[0]._M_p + 1));
          }
          iVar9 = 0;
          if (((ulong)local_540 & 0xfffffffd) == 0) {
            iVar9 = 3;
LAB_002142e6:
            bVar7 = false;
          }
          else {
            bVar7 = true;
            if (local_540._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_458,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_458,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_458,0xefc);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              local_5b0 = (undefined1  [8])&local_5a0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_5b0,"Parsing attribute `{}` failed. Error: {}","");
              pPVar14 = (Property *)local_538;
              fmt::format<char[14],std::__cxx11::string>
                        (&local_588,(fmt *)local_5b0,(string *)"clippingRange",
                         (char (*) [14])pPVar14,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1
                        );
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_458,local_588._M_dataplus._M_p,
                                   CONCAT62(local_588._M_string_length._2_6_,
                                            (undefined2)local_588._M_string_length));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_588._M_dataplus._M_p != &local_588.field_2) {
                operator_delete(local_588._M_dataplus._M_p,
                                CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                         local_588.field_2._M_allocated_capacity._0_2_) + 1);
              }
              pTVar20 = local_548;
              if (local_5b0 != (undefined1  [8])&local_5a0) {
                operator_delete((void *)local_5b0,(ulong)(local_5a0._M_allocated_capacity + 1));
              }
              if (pTVar20 !=
                  (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)0x0)
              {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+(&local_588,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_5b0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pTVar20);
                ::std::__cxx11::string::operator=((string *)pTVar20,(string *)&local_588);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_588._M_dataplus._M_p != &local_588.field_2) {
                  operator_delete(local_588._M_dataplus._M_p,
                                  CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                           local_588.field_2._M_allocated_capacity._0_2_) + 1);
                }
                if (local_5b0 != (undefined1  [8])&local_5a0) {
                  operator_delete((void *)local_5b0,(ulong)(local_5a0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
              ::std::ios_base::~ios_base(local_3e8);
              iVar9 = 1;
              goto LAB_002142e6;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._0_8_ != &local_528) {
            operator_delete((void *)local_538._0_8_,(ulong)(local_528._M_allocated_capacity + 1));
          }
          if (!bVar7) goto LAB_00215ecd;
          local_2a0._0_8_ = (long)local_2a0 + 0x10;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2a0,*(long *)(uVar16 + 0x20),
                     (long)&(*(_Base_ptr *)(uVar16 + 0x28))->_M_color + *(long *)(uVar16 + 0x20));
          local_4a8._0_8_ = local_4a8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"clippingPlanes","")
          ;
          uVar6 = local_2a0._8_8_;
          uVar5 = local_4a8._8_8_;
          local_5a8 = local_5a0._M_local_buf + 8;
          local_5a0._M_allocated_capacity = 0;
          local_5a0._M_local_buf[8] = '\0';
          __n = (pointer)local_2a0._8_8_;
          if ((ulong)local_4a8._8_8_ < (ulong)local_2a0._8_8_) {
            __n = (pointer)local_4a8._8_8_;
          }
          if (__n == (pointer)0x0) {
            if (local_2a0._8_8_ == local_4a8._8_8_) goto LAB_002143cb;
LAB_00214548:
            local_5b0._0_4_ = 1;
          }
          else {
            iVar9 = bcmp((void *)local_2a0._0_8_,(void *)local_4a8._0_8_,(size_t)__n);
            if ((uVar6 != uVar5) || (iVar9 != 0)) goto LAB_00214548;
LAB_002143cb:
            if ((*(uint *)(uVar16 + 0x2ec) & 0xfffffffe) == 2) {
              local_5b0._0_4_ = 7;
              local_540 = (undefined1  [8])(local_538 + 8);
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_540,
                         "Property `{}` must be Attribute, but declared as Relationship.","");
              fmt::format<std::__cxx11::string>
                        ((string *)local_458,(fmt *)local_540,(string *)local_4a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar14);
              ::std::__cxx11::string::operator=((string *)&local_5a8,(string *)local_458);
              if (local_458 != (undefined1  [8])local_448) {
                operator_delete((void *)local_458,(ulong)((long)local_448 + 1));
              }
              if (local_540 != (undefined1  [8])(local_538 + 8)) {
                operator_delete((void *)local_540,(ulong)(local_538._8_8_ + 1));
              }
            }
            if (*(_Base_ptr *)(uVar16 + 0xd0) != *(_Base_ptr *)(uVar16 + 200)) {
              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_270._24_8_
                         ,(vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(uVar16 + 200))
              ;
              local_5b0 = (undefined1  [8])((ulong)local_5b0 & 0xffffffff00000000);
            }
            Attribute::type_name_abi_cxx11_((string *)&local_488,(Attribute *)abStack_500._8_8_);
            tinyusdz::value::
            TypeTraits<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>::
            type_name_abi_cxx11_();
            auVar23 = local_458;
            if ((auStack_450 != (undefined1  [8])local_488._8_8_) ||
               ((bVar7 = true, auStack_450 != (undefined1  [8])0x0 &&
                (iVar9 = bcmp((void *)local_458,(void *)local_488._M_allocated_capacity,
                              (size_t)auStack_450), iVar9 != 0)))) {
              tinyusdz::value::
              TypeTraits<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>::
              underlying_type_name_abi_cxx11_();
              auVar4 = local_540;
              if (local_538._0_8_ == local_488._8_8_) {
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_538._0_8_ ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  bVar7 = true;
                }
                else {
                  iVar9 = bcmp((void *)local_540,(void *)local_488._M_allocated_capacity,
                               local_538._0_8_);
                  bVar7 = iVar9 == 0;
                }
              }
              else {
                bVar7 = false;
              }
              auVar23 = local_458;
              if (auVar4 != (undefined1  [8])(local_538 + 8)) {
                operator_delete((void *)auVar4,(ulong)(local_538._8_8_ + 1));
                auVar23 = local_458;
              }
            }
            if (auVar23 != (undefined1  [8])local_448) {
              operator_delete((void *)auVar23,(ulong)((long)local_448 + 1));
            }
            if (bVar7) {
              if (*(int *)(uVar16 + 0x2ec) == 1) {
                if (*(_Base_ptr *)(uVar16 + 0xb0) == *(_Base_ptr *)(uVar16 + 0xa8)) {
                  if (*(_Base_ptr *)(uVar16 + 0x98) == (_Base_ptr)0x0) {
                    bVar7 = false;
                  }
                  else {
                    iVar9 = (**(code **)*(_Base_ptr *)(uVar16 + 0x98))();
                    bVar7 = iVar9 == 4;
                  }
                  uVar8 = (undefined1)((_Base_ptr)(uVar16 + 0xa0))->_M_color;
                  if ((bVar7) || ((uVar8 & _S_black) != _S_red)) {
                    *(bool *)(local_478._24_8_ + 0x20d8) = true;
                  }
                }
                else {
                  uVar8 = (undefined1)((_Base_ptr)(uVar16 + 0xa0))->_M_color;
                }
                if (((((uVar8 & _S_black) == _S_red) &&
                     (*(_Base_ptr *)(uVar16 + 0x98) != (_Base_ptr)0x0)) &&
                    ((iVar9 = (**(code **)*(_Base_ptr *)(uVar16 + 0x98))(), iVar9 == 0 ||
                     ((*(_Base_ptr *)(uVar16 + 0x98) != (_Base_ptr)0x0 &&
                      (iVar9 = (**(code **)*(_Base_ptr *)(uVar16 + 0x98))(), iVar9 == 1)))))) &&
                   (*(_Base_ptr *)(uVar16 + 0xb0) == *(_Base_ptr *)(uVar16 + 0xa8))) {
                  if (*(_Base_ptr *)(uVar16 + 0xd0) == *(_Base_ptr *)(uVar16 + 200))
                  goto LAB_00214c35;
                  AttrMetas::operator=(local_4d0,(AttrMetas *)(uVar16 + 0xe0));
                  __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_2a0;
                  goto LAB_00214c28;
                }
                local_568._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                local_568._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
                local_568._dirty = false;
                local_568._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_568._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                local_568._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                local_588.field_2._M_allocated_capacity._0_2_ = 0;
                local_588.field_2._M_allocated_capacity._2_6_ = 0;
                local_588.field_2._8_2_ = 0;
                local_588._M_dataplus._M_p = (pointer)0x0;
                local_588._M_string_length._0_2_ = 0;
                local_588._M_string_length._2_6_ = 0;
                bVar7 = primvar::PrimVar::is_valid((PrimVar *)(uVar16 + 0x88));
                if (bVar7) {
                  if ((((char)((_Base_ptr)(uVar16 + 0xa0))->_M_color == _S_red) &&
                      (*(_Base_ptr *)(uVar16 + 0x98) != (_Base_ptr)0x0)) &&
                     ((iVar9 = (**(code **)*(_Base_ptr *)(uVar16 + 0x98))(), iVar9 == 0 ||
                      ((*(_Base_ptr *)(uVar16 + 0x98) != (_Base_ptr)0x0 &&
                       (iVar9 = (**(code **)*(_Base_ptr *)(uVar16 + 0x98))(), iVar9 == 1)))))) {
                    bVar22 = 0;
                  }
                  else {
                    primvar::PrimVar::
                    get_value<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                              (&local_1f8,(PrimVar *)(uVar16 + 0x88));
                    bVar22 = local_1f8.has_value_;
                    local_4c8 = local_1f8.has_value_;
                    if (local_1f8.has_value_ != false) {
                      local_4c0.
                      super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (pointer)local_1f8.contained.data._0_8_;
                      local_4c0.
                      super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           (pointer)local_1f8.contained._8_8_;
                      local_4c0.
                      super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                           (pointer)local_1f8.contained._16_8_;
                      ::std::
                      vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
                      operator=((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                 *)&local_588,&local_4c0);
                      local_588.field_2._8_2_ = 1;
                    }
                    if (((local_4c8 & 1) != 0) &&
                       ((anon_struct_8_0_00000001_for___align)
                        local_4c0.
                        super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start !=
                        (anon_struct_8_0_00000001_for___align)0x0)) {
                      operator_delete(local_4c0.
                                      super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_4c0.
                                            super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_4c0.
                                            super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                  }
                  p_Var13 = *(_Base_ptr *)(uVar16 + 0xa8);
                  if (*(_Base_ptr *)(uVar16 + 0xb0) == p_Var13) {
                    if (bVar22 == 0) {
                      local_540 = (undefined1  [8])((ulong)local_540 & 0xffffffffffffff00);
                      local_508 = 0;
                      abStack_500[0] = false;
                      abStack_500[1] = false;
                      abStack_500[2] = false;
                      abStack_500[3] = false;
                      abStack_500[4] = false;
                      abStack_500[5] = false;
                      abStack_500[6] = false;
                      abStack_500[7] = false;
                      local_518 = (pointer)0x0;
                      _Stack_510._M_p = (pointer)0x0;
                      local_528._M_allocated_capacity = 0;
                      local_528._8_8_ = 0;
                      local_538._0_8_ =
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x0;
                      local_538._8_8_ = (code *)0x0;
                      goto LAB_00214863;
                    }
                  }
                  else {
                    local_2a0._32_8_ = uVar16 + 0xa8;
                    lVar24 = 0;
                    uVar15 = 0;
                    do {
                      uVar5 = local_2a0._32_8_;
                      local_478._16_8_ = uVar15;
                      if ((char)((_Base_ptr)(uVar16 + 0xc0))->_M_color == _S_black) {
                        tinyusdz::value::TimeSamples::update((TimeSamples *)local_2a0._32_8_);
                        p_Var13 = *(_Base_ptr *)uVar5;
                      }
                      if (*(char *)((long)&p_Var13[1]._M_color + lVar24) == '\x01') {
                        TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                        ::add_blocked_sample
                                  (&local_568,*(double *)((long)&p_Var13->_M_color + lVar24));
                      }
                      else {
                        tinyusdz::value::Value::
                        get_value<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                                  (&local_1f8,(Value *)((long)&p_Var13->_M_parent + lVar24),false);
                        bVar7 = local_1f8.has_value_;
                        local_4c8 = local_1f8.has_value_;
                        local_2a0._40_8_ = lVar24;
                        if (local_1f8.has_value_ == true) {
                          local_4c0.
                          super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start =
                               (pointer)local_1f8.contained.data._0_8_;
                          local_4c0.
                          super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish =
                               (pointer)local_1f8.contained._8_8_;
                          local_4c0.
                          super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage =
                               (pointer)local_1f8.contained._16_8_;
                          TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                          ::add_sample(&local_568,*(double *)((long)&p_Var13->_M_color + lVar24),
                                       &local_4c0);
                        }
                        else {
                          local_508 = 0;
                          abStack_500[0] = false;
                          abStack_500[1] = false;
                          abStack_500[2] = false;
                          abStack_500[3] = false;
                          abStack_500[4] = false;
                          abStack_500[5] = false;
                          abStack_500[6] = false;
                          abStack_500[7] = false;
                          local_518 = (pointer)0x0;
                          _Stack_510._M_p = (pointer)0x0;
                          local_528._M_allocated_capacity = 0;
                          local_528._8_8_ = 0;
                          local_538._0_8_ =
                               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)0x0;
                          local_538._8_8_ = (code *)0x0;
                        }
                        if (((local_4c8 & 1) != 0) &&
                           ((anon_struct_8_0_00000001_for___align)
                            local_4c0.
                            super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start !=
                            (anon_struct_8_0_00000001_for___align)0x0)) {
                          operator_delete(local_4c0.
                                          super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_4c0.
                                                super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_4c0.
                                                super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        lVar24 = local_2a0._40_8_;
                        if (bVar7 == false) {
                          local_540 = (undefined1  [8])((ulong)local_540 & 0xffffffffffffff00);
                          goto LAB_00214863;
                        }
                      }
                      uVar15 = local_478._16_8_ + 1;
                      p_Var13 = *(_Base_ptr *)(uVar16 + 0xa8);
                      lVar24 = lVar24 + 0x28;
                    } while (uVar15 < (ulong)(((long)*(_Base_ptr *)(uVar16 + 0xb0) - (long)p_Var13
                                              >> 3) * -0x3333333333333333));
                  }
                  local_540[0] = 1;
                  local_538._8_8_ =
                       CONCAT62(local_588._M_string_length._2_6_,
                                (undefined2)local_588._M_string_length);
                  local_538._0_8_ = local_588._M_dataplus._M_p;
                  local_528._M_allocated_capacity =
                       CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                local_588.field_2._M_allocated_capacity._0_2_);
                  local_588._M_dataplus._M_p = (pointer)0x0;
                  local_588._M_string_length._0_2_ = 0;
                  local_588._M_string_length._2_6_ = 0;
                  local_588.field_2._M_allocated_capacity._0_2_ = 0;
                  local_588.field_2._M_allocated_capacity._2_6_ = 0;
                  local_528._8_2_ = local_588.field_2._8_2_;
                  _Stack_510._M_p =
                       (pointer)CONCAT71(local_568._samples.
                                         super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                                         ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                         local_568._samples.
                                         super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                                         ._M_impl.super__Vector_impl_data._M_finish._0_1_);
                  local_518 = local_568._samples.
                              super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  local_508 = CONCAT71(local_568._samples.
                                       super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                       local_568._samples.
                                       super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
                  local_568._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                  local_568._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
                  local_568._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_568._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                  local_568._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                  abStack_500[0] = local_568._dirty;
                  cVar18 = '\x01';
                }
                else {
                  local_540 = (undefined1  [8])((ulong)local_540 & 0xffffffffffffff00);
                  local_508 = 0;
                  abStack_500[0] = false;
                  abStack_500[1] = false;
                  abStack_500[2] = false;
                  abStack_500[3] = false;
                  abStack_500[4] = false;
                  abStack_500[5] = false;
                  abStack_500[6] = false;
                  abStack_500[7] = false;
                  local_518 = (pointer)0x0;
                  _Stack_510._M_p = (pointer)0x0;
                  local_528._M_allocated_capacity = 0;
                  local_528._8_8_ = 0;
                  local_538._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_538._8_8_ = (code *)0x0;
LAB_00214863:
                  cVar18 = '\0';
                }
                ::std::
                vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                ::~vector(&local_568._samples);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_588._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_588._M_dataplus._M_p,
                                  CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                           local_588.field_2._M_allocated_capacity._0_2_) -
                                  (long)local_588._M_dataplus._M_p);
                }
                local_458[0] = cVar18;
                if (cVar18 == '\0') {
                  local_5b0._0_4_ = 8;
                  args_1 = (Property *)0x55;
                  ::std::__cxx11::string::_M_replace
                            ((ulong)&local_5a8,0,(char *)local_5a0._M_allocated_capacity,0x3a1ff6);
                }
                else {
                  auStack_450 = (undefined1  [8])local_538._0_8_;
                  local_448 = (undefined1  [8])local_538._8_8_;
                  auStack_440._0_8_ = local_528._M_allocated_capacity;
                  local_528._M_allocated_capacity = 0;
                  local_538._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_538._8_8_ = (code *)0x0;
                  auStack_440._8_2_ = local_528._8_2_;
                  auStack_440._16_8_ = local_518;
                  auStack_440._24_8_ = _Stack_510._M_p;
                  auStack_440._32_8_ = local_508;
                  local_508 = 0;
                  local_518 = (pointer)0x0;
                  _Stack_510._M_p = (pointer)0x0;
                  auStack_440[0x28] = abStack_500[0];
                  nonstd::optional_lite::detail::
                  storage_t<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
                  ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
                                    *)local_538);
                  nonstd::optional_lite::
                  optional<tinyusdz::Animatable<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>>
                  ::operator=((optional<tinyusdz::Animatable<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>>
                               *)local_270._8_8_,
                              (Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                               *)auStack_450);
                }
                if ((string)local_458[0] == (string)0x1) {
                  nonstd::optional_lite::detail::
                  storage_t<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
                  ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
                                    *)auStack_450);
                }
                if (cVar18 != '\0') goto LAB_00214c09;
              }
              else if (*(int *)(uVar16 + 0x2ec) == 0) {
                *(bool *)(local_478._24_8_ + 0x2070) = true;
LAB_00214c09:
                AttrMetas::operator=(local_4d0,(AttrMetas *)(uVar16 + 0xe0));
                __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8
                ;
LAB_00214c28:
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_2d0,__v);
                local_5b0 = (undefined1  [8])((ulong)local_5b0 & 0xffffffff00000000);
              }
              else {
                args_1 = (Property *)0x25;
                ::std::__cxx11::string::_M_replace
                          ((ulong)&local_5a8,0,(char *)local_5a0._M_allocated_capacity,0x3a1d28);
                local_5b0._0_4_ = 8;
              }
            }
            else {
              local_5b0._0_4_ = 3;
              ::std::__cxx11::stringstream::stringstream((stringstream *)local_458);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_448,"Property type mismatch. ",0x18);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_448,(char *)local_4a8._0_8_,local_4a8._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," expects type `",0xf);
              tinyusdz::value::
              TypeTraits<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>::
              type_name_abi_cxx11_();
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(char *)local_540,local_538._0_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,"` but defined as type `",0x17);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(char *)local_488._M_allocated_capacity,local_488._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"`",1);
              if (local_540 != (undefined1  [8])(local_538 + 8)) {
                operator_delete((void *)local_540,(ulong)(local_538._8_8_ + 1));
              }
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::operator=((string *)&local_5a8,(string *)local_540);
              if (local_540 != (undefined1  [8])(local_538 + 8)) {
                operator_delete((void *)local_540,(ulong)(local_538._8_8_ + 1));
              }
              ::std::__cxx11::stringstream::~stringstream((stringstream *)local_458);
              ::std::ios_base::~ios_base(local_3d8);
            }
LAB_00214c35:
            if ((undefined1 *)local_488._M_allocated_capacity != local_478) {
              operator_delete((void *)local_488._M_allocated_capacity,local_478._0_8_ + 1);
            }
          }
          if ((pointer)local_4a8._0_8_ != (pointer)(local_4a8 + 0x10)) {
            operator_delete((void *)local_4a8._0_8_,local_4a8._16_8_ + 1);
          }
          if (local_2a0._0_8_ != (long)local_2a0 + 0x10) {
            operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
          }
          iVar9 = 0;
          if (((ulong)local_5b0 & 0xfffffffd) == 0) {
            iVar9 = 3;
LAB_00214ea1:
            bVar7 = false;
          }
          else {
            bVar7 = true;
            if (local_5b0._0_4_ != 1) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_458,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_458,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_458,0xefe);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_588,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[15],std::__cxx11::string>
                        ((string *)local_540,(fmt *)&local_588,(string *)"clippingPlanes",
                         (char (*) [15])&local_5a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1
                        );
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_458,(char *)local_540,local_538._0_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if (local_540 != (undefined1  [8])(local_538 + 8)) {
                operator_delete((void *)local_540,(ulong)(local_538._8_8_ + 1));
              }
              pTVar20 = local_548;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_588._M_dataplus._M_p != &local_588.field_2) {
                operator_delete(local_588._M_dataplus._M_p,
                                CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                         local_588.field_2._M_allocated_capacity._0_2_) + 1);
              }
              if (pTVar20 !=
                  (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)0x0)
              {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_540,&local_588,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pTVar20);
                ::std::__cxx11::string::operator=((string *)pTVar20,(string *)local_540);
                if (local_540 != (undefined1  [8])(local_538 + 8)) {
                  operator_delete((void *)local_540,(ulong)(local_538._8_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_588._M_dataplus._M_p != &local_588.field_2) {
                  operator_delete(local_588._M_dataplus._M_p,
                                  CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                           local_588.field_2._M_allocated_capacity._0_2_) + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
              ::std::ios_base::~ios_base(local_3e8);
              iVar9 = 1;
              goto LAB_00214ea1;
            }
          }
          if (local_5a8 != local_5a0._M_local_buf + 8) {
            operator_delete(local_5a8,CONCAT71(local_5a0._9_7_,local_5a0._M_local_buf[8]) + 1);
          }
          if (!bVar7) goto LAB_00215ecd;
          local_170._0_8_ = (long)local_170 + 0x10;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_170,*(long *)(uVar16 + 0x20),
                     (long)&(*(_Base_ptr *)(uVar16 + 0x28))->_M_color + *(long *)(uVar16 + 0x20));
          local_458 = (undefined1  [8])local_448;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"shutter:open","");
          pPVar14 = (Property *)local_458;
          anon_unknown_0::ParseTypedAttribute<double>
                    ((ParseResult *)local_540,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2d0,(string *)local_170,(Property *)abStack_500._8_8_,
                     (string *)local_458,
                     (TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *)
                     local_250._M_allocated_capacity);
          if (local_458 != (undefined1  [8])local_448) {
            operator_delete((void *)local_458,(ulong)((long)local_448 + 1));
          }
          if (local_170._0_8_ != (long)local_170 + 0x10) {
            operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
          }
          iVar9 = 0;
          if (((ulong)local_540 & 0xfffffffd) == 0) {
            iVar9 = 3;
LAB_00215167:
            bVar7 = false;
          }
          else {
            bVar7 = true;
            if (local_540._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_458,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_458,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_458,0xeff);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              local_5b0 = (undefined1  [8])&local_5a0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_5b0,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[13],std::__cxx11::string>
                        (&local_588,(fmt *)local_5b0,(string *)"shutter:open",
                         (char (*) [13])local_538,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar14);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_458,local_588._M_dataplus._M_p,
                                   CONCAT62(local_588._M_string_length._2_6_,
                                            (undefined2)local_588._M_string_length));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_588._M_dataplus._M_p != &local_588.field_2) {
                operator_delete(local_588._M_dataplus._M_p,
                                CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                         local_588.field_2._M_allocated_capacity._0_2_) + 1);
              }
              pTVar20 = local_548;
              if (local_5b0 != (undefined1  [8])&local_5a0) {
                operator_delete((void *)local_5b0,(ulong)(local_5a0._M_allocated_capacity + 1));
              }
              if (pTVar20 !=
                  (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)0x0)
              {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+(&local_588,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_5b0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pTVar20);
                ::std::__cxx11::string::operator=((string *)pTVar20,(string *)&local_588);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_588._M_dataplus._M_p != &local_588.field_2) {
                  operator_delete(local_588._M_dataplus._M_p,
                                  CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                           local_588.field_2._M_allocated_capacity._0_2_) + 1);
                }
                if (local_5b0 != (undefined1  [8])&local_5a0) {
                  operator_delete((void *)local_5b0,(ulong)(local_5a0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
              ::std::ios_base::~ios_base(local_3e8);
              iVar9 = 1;
              goto LAB_00215167;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._0_8_ != &local_528) {
            operator_delete((void *)local_538._0_8_,(ulong)(local_528._M_allocated_capacity + 1));
          }
          if (!bVar7) goto LAB_00215ecd;
          local_190._M_allocated_capacity = (size_type)&local_180;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_190,*(long *)(uVar16 + 0x20),
                     (long)&(*(_Base_ptr *)(uVar16 + 0x28))->_M_color + *(long *)(uVar16 + 0x20));
          local_458 = (undefined1  [8])local_448;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"shutter:close","");
          pPVar14 = (Property *)local_458;
          anon_unknown_0::ParseTypedAttribute<double>
                    ((ParseResult *)local_540,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2d0,(string *)&local_190,(Property *)abStack_500._8_8_,
                     (string *)local_458,
                     (TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *)local_270._16_8_);
          if (local_458 != (undefined1  [8])local_448) {
            operator_delete((void *)local_458,(ulong)((long)local_448 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_allocated_capacity != &local_180) {
            operator_delete((void *)local_190._M_allocated_capacity,
                            (ulong)(local_180._M_allocated_capacity + 1));
          }
          iVar9 = 0;
          if (((ulong)local_540 & 0xfffffffd) == 0) {
            iVar9 = 3;
LAB_00215436:
            bVar7 = false;
          }
          else {
            bVar7 = true;
            if (local_540._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_458,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_458,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_458,0xf01);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              local_5b0 = (undefined1  [8])&local_5a0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_5b0,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[14],std::__cxx11::string>
                        (&local_588,(fmt *)local_5b0,(string *)"shutter:close",
                         (char (*) [14])local_538,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar14);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_458,local_588._M_dataplus._M_p,
                                   CONCAT62(local_588._M_string_length._2_6_,
                                            (undefined2)local_588._M_string_length));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_588._M_dataplus._M_p != &local_588.field_2) {
                operator_delete(local_588._M_dataplus._M_p,
                                CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                         local_588.field_2._M_allocated_capacity._0_2_) + 1);
              }
              pTVar20 = local_548;
              if (local_5b0 != (undefined1  [8])&local_5a0) {
                operator_delete((void *)local_5b0,(ulong)(local_5a0._M_allocated_capacity + 1));
              }
              if (pTVar20 !=
                  (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)0x0)
              {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+(&local_588,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_5b0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pTVar20);
                ::std::__cxx11::string::operator=((string *)pTVar20,(string *)&local_588);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_588._M_dataplus._M_p != &local_588.field_2) {
                  operator_delete(local_588._M_dataplus._M_p,
                                  CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                           local_588.field_2._M_allocated_capacity._0_2_) + 1);
                }
                if (local_5b0 != (undefined1  [8])&local_5a0) {
                  operator_delete((void *)local_5b0,(ulong)(local_5a0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
              ::std::ios_base::~ios_base(local_3e8);
              iVar9 = 1;
              goto LAB_00215436;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._0_8_ != &local_528) {
            operator_delete((void *)local_538._0_8_,(ulong)(local_528._M_allocated_capacity + 1));
          }
          if (!bVar7) goto LAB_00215ecd;
          p_Var13 = (_Base_ptr)(uVar16 + 0x20);
          iVar9 = ::std::__cxx11::string::compare((char *)p_Var13);
          if (iVar9 != 0) {
            iVar9 = ::std::__cxx11::string::compare((char *)p_Var13);
            if (iVar9 == 0) {
              local_458 = (undefined1  [8])local_448;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"stereoRole","")
              ;
              cVar12 = ::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_2d0,(key_type *)local_458);
              if (local_458 != (undefined1  [8])local_448) {
                operator_delete((void *)local_458,(ulong)((long)local_448 + 1));
              }
              pTVar20 = local_548;
              if ((_Rb_tree_header *)cVar12._M_node == &local_2d0._M_impl.super__Rb_tree_header) {
                if ((*(uint *)(uVar16 + 0x2ec) & 0xfffffffe) != 2) {
                  Attribute::type_name_abi_cxx11_
                            ((string *)local_458,(Attribute *)abStack_500._8_8_);
                  local_540 = (undefined1  [8])(local_538 + 8);
                  local_538._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x5;
                  local_538._8_6_ = 0x6e656b6f74;
                  if (((auStack_450 == (undefined1  [8])0x5) &&
                      (*(char *)((long)local_458 + 4) == 'n' && *(int *)local_458 == 0x656b6f74)) &&
                     (uVar2 = *(uint *)(uVar16 + 0x2ec), uVar2 < 2)) {
                    if (local_458 != (undefined1  [8])local_448) {
                      operator_delete((void *)local_458,(ulong)((long)local_448 + 1));
                    }
                    uVar16 = local_4f0.dynamic;
                    pTVar20 = local_548;
                    if (uVar2 == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_458,"[warn]",6);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_458,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_458,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_458,"ReconstructPrim",0xf);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_458,"():",3);
                      poVar10 = (ostream *)
                                ::std::ostream::operator<<((ostringstream *)local_458,0xf05);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_458,"No value assigned to `",0x16);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_458,"stereoRole",10);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_458,"` token attribute. Set default token value.",
                                 0x2b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_458,"\n",1);
                      if ((string *)local_4f0._8_8_ != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_540,&local_588,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_548);
                        ::std::__cxx11::string::operator=
                                  ((string *)local_4f0._8_8_,(string *)local_540);
                        if (local_540 != (undefined1  [8])(local_538 + 8)) {
                          operator_delete((void *)local_540,(ulong)(local_538._8_8_ + 1));
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_588._M_dataplus._M_p != &local_588.field_2) {
                          operator_delete(local_588._M_dataplus._M_p,
                                          CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                                   local_588.field_2._M_allocated_capacity._0_2_) +
                                          1);
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
                      ::std::ios_base::~ios_base(local_3e8);
                      AttrMetas::operator=
                                (&local_4e0->_metas,(AttrMetas *)((long)local_4f0.dynamic + 0xe0));
                      pcVar17 = "stereoRole";
                      pcVar3 = "stereoRole";
                      goto LAB_00215ae3;
                    }
                  }
                  else if (local_458 != (undefined1  [8])local_448) {
                    operator_delete((void *)local_458,(ulong)((long)local_448 + 1));
                  }
                }
                local_458 = (undefined1  [8])0x0;
                auStack_450 = (undefined1  [8])0x0;
                auStack_440._0_8_ =
                     ::std::
                     _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomCamera::StereoRole,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3790:28)>
                     ::_M_invoke;
                local_448 = (undefined1  [8])
                            ::std::
                            _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomCamera::StereoRole,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3790:28)>
                            ::_M_manager;
                local_540 = (undefined1  [8])(local_538 + 8);
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_540,"stereoRole","");
                bVar7 = options->strict_allowedToken_check;
                local_1d8._16_8_ = (pointer)0x0;
                oStack_1c0.has_value_ = false;
                oStack_1c0._1_3_ = 0;
                oStack_1c0.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
                local_1d8._0_8_ = (_Base_ptr)0x0;
                local_1d8._8_8_ = 0;
                if (local_448 != (undefined1  [8])0x0) {
                  (*(code *)local_448)(local_1d8,local_458,2);
                  local_1d8._16_8_ = local_448;
                  oStack_1c0.has_value_ = (bool)auStack_440[0];
                  oStack_1c0._1_3_ = auStack_440._1_3_;
                  oStack_1c0.contained = (storage_t<tinyusdz::Path::PathType>)auStack_440._4_4_;
                }
                bVar7 = ParseUniformEnumProperty<tinyusdz::GeomCamera::StereoRole,tinyusdz::GeomCamera::StereoRole>
                                  ((string *)local_540,bVar7,
                                   (EnumHandlerFun<tinyusdz::GeomCamera::StereoRole> *)local_1d8,
                                   (Attribute *)abStack_500._8_8_,local_4e0,
                                   (string *)local_4f0._8_8_,(string *)pTVar20);
                if ((pointer)local_1d8._16_8_ != (pointer)0x0) {
                  (*(code *)local_1d8._16_8_)(local_1d8,local_1d8,3);
                }
                if (local_540 != (undefined1  [8])(local_538 + 8)) {
                  operator_delete((void *)local_540,(ulong)(local_538._8_8_ + 1));
                }
                iVar9 = 1;
                if (bVar7) {
                  AttrMetas::operator=(&local_4e0->_metas,(AttrMetas *)(uVar16 + 0xe0));
                  pcVar17 = "stereoRole";
                  pcVar3 = "stereoRole";
                  goto LAB_00215e76;
                }
                goto LAB_00215eab;
              }
              goto LAB_00215edc;
            }
            cVar12 = ::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&local_2d0,(key_type *)p_Var13);
            p_Var19 = &local_2d0._M_impl.super__Rb_tree_header;
            if ((_Rb_tree_header *)cVar12._M_node == p_Var19) {
              this = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                   *)local_270._0_8_,(key_type *)p_Var13);
              Property::operator=(this,(Property *)abStack_500._8_8_);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_2d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         p_Var13);
            }
            cVar12 = ::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&local_2d0,(key_type *)p_Var13);
            if ((_Rb_tree_header *)cVar12._M_node != p_Var19) goto LAB_00215edc;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_458,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_458,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"():",3);
            poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_458,0xf07);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_540,"Unsupported/unimplemented property: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             p_Var13);
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_458,(char *)local_540,local_538._0_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            if (local_540 != (undefined1  [8])(local_538 + 8)) {
              operator_delete((void *)local_540,(ulong)(local_538._8_8_ + 1));
            }
            if (local_548 !=
                (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)0x0) {
              ::std::__cxx11::stringbuf::str();
              pTVar25 = local_548;
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_540,&local_588,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_548);
              ::std::__cxx11::string::operator=((string *)pTVar25,(string *)local_540);
              if (local_540 != (undefined1  [8])(local_538 + 8)) {
                operator_delete((void *)local_540,(ulong)(local_538._8_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_588._M_dataplus._M_p != &local_588.field_2) {
                operator_delete(local_588._M_dataplus._M_p,
                                CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                         local_588.field_2._M_allocated_capacity._0_2_) + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
            ::std::ios_base::~ios_base(local_3e8);
            goto LAB_0021608c;
          }
          local_458 = (undefined1  [8])local_448;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"projection","");
          cVar12 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&local_2d0,(key_type *)local_458);
          if (local_458 != (undefined1  [8])local_448) {
            operator_delete((void *)local_458,(ulong)((long)local_448 + 1));
          }
          pTVar20 = local_548;
          if ((_Rb_tree_header *)cVar12._M_node == &local_2d0._M_impl.super__Rb_tree_header) {
            if ((*(uint *)(uVar16 + 0x2ec) & 0xfffffffe) != 2) {
              Attribute::type_name_abi_cxx11_((string *)local_458,(Attribute *)abStack_500._8_8_);
              local_540 = (undefined1  [8])(local_538 + 8);
              local_538._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x5;
              local_538._8_6_ = 0x6e656b6f74;
              if (((auStack_450 == (undefined1  [8])0x5) &&
                  (*(char *)((long)local_458 + 4) == 'n' && *(int *)local_458 == 0x656b6f74)) &&
                 (uVar2 = *(uint *)(uVar16 + 0x2ec), uVar2 < 2)) {
                if (local_458 != (undefined1  [8])local_448) {
                  operator_delete((void *)local_458,(ulong)((long)local_448 + 1));
                }
                uVar16 = local_4f0.dynamic;
                pTVar20 = local_548;
                if (uVar2 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_458,"[warn]",6);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_458,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_458,"ReconstructPrim",0xf);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"():",3)
                  ;
                  poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_458,0xf03);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_458,"No value assigned to `",0x16);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_458,"projection",10);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_458,"` token attribute. Set default token value.",0x2b
                            );
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"\n",1);
                  if ((string *)local_4f0._8_8_ != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_540,&local_588,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_548);
                    ::std::__cxx11::string::operator=((string *)local_4f0._8_8_,(string *)local_540)
                    ;
                    if (local_540 != (undefined1  [8])(local_538 + 8)) {
                      operator_delete((void *)local_540,(ulong)(local_538._8_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_588._M_dataplus._M_p != &local_588.field_2) {
                      operator_delete(local_588._M_dataplus._M_p,
                                      CONCAT62(local_588.field_2._M_allocated_capacity._2_6_,
                                               local_588.field_2._M_allocated_capacity._0_2_) + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
                  ::std::ios_base::~ios_base(local_3e8);
                  AttrMetas::operator=
                            (&local_4d8->_metas,(AttrMetas *)((long)local_4f0.dynamic + 0xe0));
                  pcVar17 = "projection";
                  pcVar3 = "projection";
LAB_00215ae3:
                  local_458 = (undefined1  [8])local_448;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_458,pcVar17,pcVar3 + 10);
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&local_2d0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_458);
                  uVar16 = local_4f0.dynamic;
                  if (local_458 != (undefined1  [8])local_448) {
                    operator_delete((void *)local_458,(ulong)((long)local_448 + 1));
                    uVar16 = local_4f0.dynamic;
                  }
                  goto LAB_00215edc;
                }
              }
              else if (local_458 != (undefined1  [8])local_448) {
                operator_delete((void *)local_458,(ulong)((long)local_448 + 1));
              }
            }
            local_458 = (undefined1  [8])0x0;
            auStack_450 = (undefined1  [8])0x0;
            auStack_440._0_8_ =
                 ::std::
                 _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomCamera::Projection,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3765:28)>
                 ::_M_invoke;
            local_448 = (undefined1  [8])
                        ::std::
                        _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomCamera::Projection,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3765:28)>
                        ::_M_manager;
            local_540 = (undefined1  [8])(local_538 + 8);
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"projection","");
            bVar7 = options->strict_allowedToken_check;
            local_1a8 = (pointer)0x0;
            _Stack_1a0._M_p = (pointer)0x0;
            local_1b8._M_unused._M_object = (pointer)0x0;
            local_1b8._8_8_ = (pointer)0x0;
            if (local_448 != (undefined1  [8])0x0) {
              (*(code *)local_448)(&local_1b8,local_458,2);
              local_1a8 = (pointer)local_448;
              _Stack_1a0._M_p = (pointer)auStack_440._0_8_;
            }
            bVar7 = ParseTimeSampledEnumProperty<tinyusdz::GeomCamera::Projection,tinyusdz::GeomCamera::Projection>
                              ((string *)local_540,bVar7,
                               (EnumHandlerFun<tinyusdz::GeomCamera::Projection> *)&local_1b8,
                               (Attribute *)abStack_500._8_8_,local_4d8,(string *)local_4f0._8_8_,
                               (string *)pTVar20);
            if (local_1a8 != (pointer)0x0) {
              (*(code *)local_1a8)(&local_1b8,&local_1b8,3);
            }
            if (local_540 != (undefined1  [8])(local_538 + 8)) {
              operator_delete((void *)local_540,(ulong)(local_538._8_8_ + 1));
            }
            iVar9 = 1;
            if (bVar7) {
              AttrMetas::operator=(&local_4d8->_metas,(AttrMetas *)(uVar16 + 0xe0));
              pcVar17 = "projection";
              pcVar3 = "projection";
LAB_00215e76:
              local_540 = (undefined1  [8])(local_538 + 8);
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_540,pcVar17,pcVar3 + 10);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_2d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_540);
              if (local_540 != (undefined1  [8])(local_538 + 8)) {
                operator_delete((void *)local_540,(ulong)(local_538._8_8_ + 1));
              }
              iVar9 = 3;
            }
LAB_00215eab:
            pTVar25 = pTVar20;
            if (local_448 != (undefined1  [8])0x0) {
              (*(code *)local_448)(local_458,local_458,3);
              pTVar25 = pTVar20;
            }
            goto LAB_00215ecd;
          }
        }
        else {
LAB_00215ecd:
          if ((iVar9 != 3) && (iVar9 != 0)) {
LAB_0021608c:
            bVar21 = false;
            goto LAB_0021608f;
          }
        }
LAB_00215edc:
        p_Var13 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)uVar16);
      } while (p_Var13 != (_Base_ptr)local_218._16_8_);
      bVar21 = true;
    }
  }
LAB_0021608f:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_2d0,(_Link_type)local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar21;
}

Assistant:

bool ReconstructPrim<GeomCamera>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomCamera *camera,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {
  (void)references;
  (void)warn;
  (void)options;

  auto ProjectionHandler = [](const std::string &tok)
      -> nonstd::expected<GeomCamera::Projection, std::string> {
    using EnumTy = std::pair<GeomCamera::Projection, const char *>;
    constexpr std::array<EnumTy, 2> enums = {
        std::make_pair(GeomCamera::Projection::Perspective, "perspective"),
        std::make_pair(GeomCamera::Projection::Orthographic, "orthographic"),
    };

    auto ret =
        CheckAllowedTokens<GeomCamera::Projection, enums.size()>(enums, tok);
    if (!ret) {
      return nonstd::make_unexpected(ret.error());
    }

    for (auto &item : enums) {
      if (tok == item.second) {
        return item.first;
      }
    }

    // Should never reach here, though.
    return nonstd::make_unexpected(
        quote(tok) + " is invalid token for `projection` propety");
  };

  auto StereoRoleHandler = [](const std::string &tok)
      -> nonstd::expected<GeomCamera::StereoRole, std::string> {
    using EnumTy = std::pair<GeomCamera::StereoRole, const char *>;
    constexpr std::array<EnumTy, 3> enums = {
        std::make_pair(GeomCamera::StereoRole::Mono, "mono"),
        std::make_pair(GeomCamera::StereoRole::Left, "left"),
        std::make_pair(GeomCamera::StereoRole::Right, "right"),
    };

    auto ret =
        CheckAllowedTokens<GeomCamera::StereoRole, enums.size()>(enums, tok);
    if (!ret) {
      return nonstd::make_unexpected(ret.error());
    }

    for (auto &item : enums) {
      if (tok == item.second) {
        return item.first;
      }
    }

    // Should never reach here, though.
    return nonstd::make_unexpected(
        quote(tok) + " is invalid token for `stereoRole` propety");
  };

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, camera, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "focalLength", GeomCamera, camera->focalLength)
    PARSE_TYPED_ATTRIBUTE(table, prop, "focusDistance", GeomCamera,
                   camera->focusDistance)
    PARSE_TYPED_ATTRIBUTE(table, prop, "exposure", GeomCamera, camera->exposure)
    PARSE_TYPED_ATTRIBUTE(table, prop, "fStop", GeomCamera, camera->fStop)
    PARSE_TYPED_ATTRIBUTE(table, prop, "horizontalAperture", GeomCamera,
                   camera->horizontalAperture)
    PARSE_TYPED_ATTRIBUTE(table, prop, "horizontalApertureOffset", GeomCamera,
                   camera->horizontalApertureOffset)
    PARSE_TYPED_ATTRIBUTE(table, prop, "verticalAperture", GeomCamera,
                   camera->verticalAperture)
    PARSE_TYPED_ATTRIBUTE(table, prop, "verticalApertureOffset", GeomCamera,
                   camera->verticalApertureOffset)
    PARSE_TYPED_ATTRIBUTE(table, prop, "clippingRange", GeomCamera,
                   camera->clippingRange)
    PARSE_TYPED_ATTRIBUTE(table, prop, "clippingPlanes", GeomCamera,
                   camera->clippingPlanes)
    PARSE_TYPED_ATTRIBUTE(table, prop, "shutter:open", GeomCamera, camera->shutterOpen)
    PARSE_TYPED_ATTRIBUTE(table, prop, "shutter:close", GeomCamera,
                   camera->shutterClose)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, "projection", GeomCamera::Projection, ProjectionHandler, GeomCamera,
                       camera->projection, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "stereoRole", GeomCamera::StereoRole, StereoRoleHandler, GeomCamera,
                       camera->stereoRole, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, GeomCamera, camera->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

  return true;
}